

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-truetype.h
# Opt level: O0

int stbtt__GetGlyphInfoT2(stbtt_fontinfo *info,int glyph_index,int *x0,int *y0,int *x1,int *y1)

{
  int iVar1;
  int local_88;
  stbtt_int32 local_84;
  float local_80;
  int local_7c;
  float local_78;
  undefined1 local_70 [4];
  int r;
  stbtt__csctx c;
  int *y1_local;
  int *x1_local;
  int *y0_local;
  int *x0_local;
  int glyph_index_local;
  stbtt_fontinfo *info_local;
  
  c._48_8_ = y1;
  memset(local_70,0,0x38);
  local_70 = (undefined1  [4])0x1;
  iVar1 = stbtt__run_charstring(info,glyph_index,(stbtt__csctx *)local_70);
  if (x0 != (int *)0x0) {
    if (iVar1 == 0) {
      local_78 = 0.0;
    }
    else {
      local_78 = c.x;
    }
    *x0 = (int)local_78;
  }
  if (y0 != (int *)0x0) {
    if (iVar1 == 0) {
      local_7c = 0;
    }
    else {
      local_7c = c.min_x;
    }
    *y0 = local_7c;
  }
  if (x1 != (int *)0x0) {
    if (iVar1 == 0) {
      local_80 = 0.0;
    }
    else {
      local_80 = c.y;
    }
    *x1 = (int)local_80;
  }
  if (c._48_8_ != 0) {
    if (iVar1 == 0) {
      local_84 = 0;
    }
    else {
      local_84 = c.max_x;
    }
    *(stbtt_int32 *)c._48_8_ = local_84;
  }
  if (iVar1 == 0) {
    local_88 = 0;
  }
  else {
    local_88 = (int)c.pvertices;
  }
  return local_88;
}

Assistant:

static int stbtt__GetGlyphInfoT2(const stbtt_fontinfo *info, int glyph_index, int *x0, int *y0, int *x1, int *y1)
{
   stbtt__csctx c = STBTT__CSCTX_INIT(1);
   int r = stbtt__run_charstring(info, glyph_index, &c);
   if (x0)  *x0 = r ? c.min_x : 0;
   if (y0)  *y0 = r ? c.min_y : 0;
   if (x1)  *x1 = r ? c.max_x : 0;
   if (y1)  *y1 = r ? c.max_y : 0;
   return r ? c.num_vertices : 0;
}